

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O0

string * __thiscall
cmCMakePresetsErrors::getVariableName_abi_cxx11_
          (string *__return_storage_ptr__,cmCMakePresetsErrors *this,cmJSONState *state)

{
  cmJSONState *state_00;
  string local_b0;
  string local_90;
  undefined1 local_6d;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string var;
  cmJSONState *state_local;
  string *errMsg;
  
  var.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"cacheVariables",&local_59)
  ;
  cmJSONState::key_after((string *)local_38,(cmJSONState *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_6d = 0;
  cmStrCat<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr__,(char (*) [11])0x1041e58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (char (*) [2])0x107e386);
  getPresetName_abi_cxx11_(&local_b0,(cmCMakePresetsErrors *)var.field_2._8_8_,state_00);
  cmStrCat<std::__cxx11::string&,char_const(&)[14],std::__cxx11::string,char_const(&)[2]>
            (&local_90,__return_storage_ptr__,(char (*) [14])0x1077338,&local_b0,
             (char (*) [2])0x107e386);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  local_6d = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string getVariableName(cmJSONState* state)
{
  std::string var = state->key_after("cacheVariables");
  std::string errMsg = cmStrCat("variable \"", var, "\"");
  errMsg = cmStrCat(errMsg, " for preset \"", getPresetName(state), "\"");
  return errMsg;
}